

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::GetProperty
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  BOOL BVar1;
  DynamicObject *instance_00;
  uint32 local_4c;
  ScriptContext *pSStack_48;
  uint32 index;
  ScriptContext *scriptContext;
  PropertyValueInfo *info_local;
  Var *value_local;
  Var pvStack_28;
  PropertyId propertyId_local;
  Var originalInstance_local;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  scriptContext = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)value;
  value_local._4_4_ = propertyId;
  pvStack_28 = originalInstance;
  originalInstance_local = instance;
  instance_local = (DynamicObject *)this;
  pSStack_48 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  BVar1 = ScriptContext::IsNumericPropertyId(pSStack_48,value_local._4_4_,&local_4c);
  if (BVar1 == 0) {
    this_local._4_4_ =
         DictionaryTypeHandlerBase<int>::GetProperty
                   (&this->super_DictionaryTypeHandlerBase<int>,
                    (DynamicObject *)originalInstance_local,pvStack_28,value_local._4_4_,
                    &info_local->m_instance,(PropertyValueInfo *)scriptContext,requestContext);
  }
  else {
    instance_00 = (DynamicObject *)
                  VarTo<Js::ES5Array,Js::DynamicObject>((DynamicObject *)originalInstance_local);
    this_local._4_4_ =
         GetItem(this,instance_00,originalInstance_local,local_4c,&info_local->m_instance,
                 requestContext);
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::GetProperty(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return GetItem(VarTo<ES5Array>(instance), instance, index, value, requestContext);
        }

        return __super::GetProperty(instance, originalInstance, propertyId, value, info, requestContext);
    }